

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O3

char * rtosc_match_path(char *pattern,char *msg,char **path_end)

{
  byte *pbVar1;
  ushort *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ushort **ppuVar6;
  byte bVar7;
  byte *pbVar8;
  byte *local_38;
  
  local_38 = (byte *)msg;
  if (path_end == (char **)0x0) {
    path_end = (char **)&local_38;
    local_38 = (byte *)msg;
  }
LAB_001135cb:
  while (bVar3 = *pattern, bVar3 < 0x2f) {
    if (bVar3 == 0x23) {
      ppuVar6 = __ctype_b_loc();
      pbVar8 = local_38;
      puVar2 = *ppuVar6;
      if ((*(byte *)((long)puVar2 + (long)(char)((byte *)pattern)[1] * 2 + 1) & 8) == 0) {
        return (char *)0x0;
      }
      if ((*(byte *)((long)puVar2 + (long)(char)*local_38 * 2 + 1) & 8) == 0) {
        return (char *)0x0;
      }
      pattern = (char *)((byte *)pattern + 1);
      uVar4 = atoi(pattern);
      uVar5 = atoi((char *)pbVar8);
      do {
        pbVar1 = (byte *)pattern + 1;
        pattern = (char *)((byte *)pattern + 1);
      } while ((*(byte *)((long)puVar2 + (long)(char)*pbVar1 * 2 + 1) & 8) != 0);
      do {
        pbVar1 = pbVar8 + 1;
        pbVar8 = pbVar8 + 1;
      } while ((*(byte *)((long)puVar2 + (long)(char)*pbVar1 * 2 + 1) & 8) != 0);
      local_38 = pbVar8;
      if (uVar4 <= uVar5) {
        return (char *)0x0;
      }
    }
    else {
      if (bVar3 != 0x2a) {
LAB_001136e3:
        bVar7 = *local_38;
        goto LAB_001136e9;
      }
      while (bVar3 != 0) {
        if ((bVar3 == 0x2f) || (bVar3 == 0x3a)) goto LAB_00113704;
        pbVar8 = (byte *)pattern + 1;
        pattern = (char *)((byte *)pattern + 1);
        bVar3 = *pbVar8;
      }
    }
  }
  if (bVar3 == 0x2f) {
    bVar7 = *local_38;
    if (bVar7 == 0x2f) {
      local_38 = local_38 + 1;
      pbVar8 = (byte *)pattern + 1;
      pattern = (char *)((byte *)pattern + 1);
      if ((*pbVar8 == 0x3a) || (*pbVar8 == 0)) goto LAB_00113722;
      goto LAB_001135cb;
    }
  }
  else {
    if (bVar3 != 0x3a) {
      if (bVar3 != 0x7b) goto LAB_001136e3;
      pattern = rtosc_match_options(pattern,(char **)&local_38);
      if ((byte *)pattern == (byte *)0x0) {
        return (char *)0x0;
      }
      goto LAB_001135cb;
    }
    bVar7 = *local_38;
    if (bVar7 == 0) goto LAB_00113722;
  }
LAB_001136e9:
  if (bVar3 != bVar7) {
    return (char *)0x0;
  }
  if (bVar3 == 0) {
LAB_00113722:
    *path_end = (char *)local_38;
    return (char *)(byte *)pattern;
  }
  pattern = (char *)((byte *)pattern + 1);
  local_38 = local_38 + 1;
  goto LAB_001135cb;
LAB_00113704:
  for (; (*local_38 != 0 && (*local_38 != 0x2f)); local_38 = local_38 + 1) {
  }
  goto LAB_001135cb;
}

Assistant:

const char *rtosc_match_path(const char *pattern,
                             const char *msg, const char** path_end)
{
    if(!path_end)
        path_end = &msg; // writing *path_end = msg later will have no effect
    while(1) {
        //Check for special characters
        if(*pattern == ':' && !*msg)
            return *path_end = msg, pattern;
        else if(*pattern == '{') {
            pattern = rtosc_match_options(pattern, &msg);
            if(!pattern)
                return NULL;
        } else if(*pattern == '*') {
            //advance message and pattern to '/' or ':' and '\0'
            while(*pattern && *pattern != '/' && *pattern != ':')
                pattern++;
            if(*pattern == '/' || *pattern == ':')
                while(*msg && *msg != '/')
                    msg++;
        } else if(*pattern == '/' && *msg == '/') {
            ++pattern;
            ++msg;
            if(*pattern == '\0' || *pattern == ':')
                return *path_end = msg, pattern;
        } else if(*pattern == '#') {
            ++pattern;
            if(!rtosc_match_number(&pattern, &msg))
                return NULL;
        } else if((*pattern == *msg)) { //verbatim compare
            if(*msg)
                ++pattern, ++msg;
            else
                return *path_end = msg, pattern;
        } else
            return NULL;
    }
}